

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fftpack.c
# Opt level: O0

int sint1f_(int *n,int *inc,double *x,int *lenx,double *wsave,int *lensav,double *work,int *lenwrk,
           int *ier)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int *in_RCX;
  int *in_RSI;
  int *in_RDI;
  int *in_R9;
  double dVar4;
  double dVar5;
  int *in_stack_00000010;
  undefined4 *in_stack_00000018;
  int ier1;
  int x_offset;
  int x_dim1;
  int *in_stack_00000058;
  undefined4 local_3c;
  
  *in_stack_00000018 = 0;
  if (*in_RCX < *in_RSI * (*in_RDI + -1) + 1) {
    *in_stack_00000018 = 1;
  }
  else {
    iVar1 = *in_R9;
    iVar2 = *in_RDI;
    iVar3 = *in_RDI;
    dVar4 = log((double)*in_RDI);
    dVar5 = log(2.0);
    if (iVar1 < iVar2 / 2 + iVar3 + (int)(dVar4 / dVar5) + 4) {
      *in_stack_00000018 = 2;
    }
    else if (*in_stack_00000010 < *in_RDI * 2 + 2) {
      *in_stack_00000018 = 3;
    }
    else {
      sintf1_((int *)work,in_stack_00000058,(double *)n,(double *)inc,x,(double *)lenx,ier);
      if (local_3c != 0) {
        *in_stack_00000018 = 0x14;
      }
    }
  }
  return 0;
}

Assistant:

int sint1f_(int *n, int *inc, fft_real_t *x, int *lenx,
	 fft_real_t *wsave, int *lensav, fft_real_t *work, int *lenwrk, int *
	ier)
{
    /* System generated locals */
    int x_dim1, x_offset;

    /* Builtin functions */


    /* Local variables */
     int ier1;
    extern /* Subroutine */ int sintf1_(int *, int *, fft_real_t *, fft_real_t *,
	    fft_real_t *, fft_real_t *, int *), xerfft_(char *, int *, ftnlen);


    /* Parameter adjustments */
    x_dim1 = *inc;
    x_offset = 1 + x_dim1;
    x -= x_offset;
    --wsave;
    --work;

    /* Function Body */
    *ier = 0;
    if (*lenx < *inc * (*n - 1) + 1) {
	*ier = 1;
	//xerfft_("SINT1F", &c__6, (ftnlen)6);
	goto L100;
    } else if (*lensav < *n / 2 + *n + (int) (log((fft_real_t) (*n)) / log(2.0))
	     + 4) {
	*ier = 2;
	//xerfft_("SINT1F", &c__8, (ftnlen)6);
	goto L100;
    } else if (*lenwrk < (*n << 1) + 2) {
	*ier = 3;
	//xerfft_("SINT1F", &c__10, (ftnlen)6);
	goto L100;
    }

    sintf1_(n, inc, &x[x_offset], &wsave[1], &work[1], &work[*n + 2], &ier1);
    if (ier1 != 0) {
	*ier = 20;
	//xerfft_("SINT1F", &c_n5, (ftnlen)6);
    }
L100:
    return 0;
}